

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadSubsectors<mapsubsector4_t,mapseg4_t>(MapData *map)

{
  undefined1 auVar1 [16];
  DWORD DVar2;
  ulong uVar3;
  FileReader *this;
  ushort local_1e;
  uint local_1c;
  uint uStack_18;
  mapsubsector4_t subd;
  DWORD maxseg;
  int i;
  MapData *map_local;
  
  DVar2 = MapData::Size(map,5);
  uStack_18 = DVar2 >> 4;
  DVar2 = MapData::Size(map,6);
  numsubsectors = SUB164(ZEXT416(DVar2) / ZEXT816(6),0);
  if ((numsubsectors == 0) || (uStack_18 == 0)) {
    Printf("This map has an incomplete BSP tree.\n");
    if (nodes != (node_t *)0x0) {
      operator_delete__(nodes);
    }
    ForceNodeBuild = true;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)numsubsectors;
    uVar3 = SUB168(auVar1 * ZEXT816(0x60),0);
    if (SUB168(auVar1 * ZEXT816(0x60),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    subsectors = (subsector_t *)operator_new__(uVar3);
    MapData::Seek(map,6);
    memset(subsectors,0,(long)numsubsectors * 0x60);
    for (subd.firstseg = 0; (int)subd.firstseg < numsubsectors; subd.firstseg = subd.firstseg + 1) {
      this = FileReader::operator>>(map->file,&local_1e);
      FileReader::operator>>(this,&local_1c);
      if (local_1e == 0) {
        Printf("Subsector %i is empty.\n",(ulong)subd.firstseg);
        if (subsectors != (subsector_t *)0x0) {
          operator_delete__(subsectors);
        }
        if (nodes != (node_t *)0x0) {
          operator_delete__(nodes);
        }
        ForceNodeBuild = true;
        return;
      }
      subsectors[(int)subd.firstseg].numlines = (uint)local_1e;
      subsectors[(int)subd.firstseg].firstline = (seg_t *)(ulong)local_1c;
      if ((seg_t *)(ulong)uStack_18 <= subsectors[(int)subd.firstseg].firstline) {
        Printf("Subsector %d contains invalid segs %u-%u\nThe BSP will be rebuilt.\n",
               (ulong)subd.firstseg,(ulong)subsectors[(int)subd.firstseg].firstline & 0xffffffff,
               (ulong)(((int)subsectors[(int)subd.firstseg].firstline +
                       subsectors[(int)subd.firstseg].numlines) - 1));
        ForceNodeBuild = true;
        if (nodes != (node_t *)0x0) {
          operator_delete__(nodes);
        }
        if (subsectors == (subsector_t *)0x0) {
          return;
        }
        operator_delete__(subsectors);
        return;
      }
      if ((ulong)uStack_18 <
          (long)&(subsectors[(int)subd.firstseg].firstline)->v1 +
          (ulong)subsectors[(int)subd.firstseg].numlines) {
        Printf("Subsector %d contains invalid segs %u-%u\nThe BSP will be rebuilt.\n",
               (ulong)subd.firstseg,(ulong)uStack_18,
               (ulong)(((int)subsectors[(int)subd.firstseg].firstline +
                       subsectors[(int)subd.firstseg].numlines) - 1));
        ForceNodeBuild = true;
        if (nodes != (node_t *)0x0) {
          operator_delete__(nodes);
        }
        if (subsectors == (subsector_t *)0x0) {
          return;
        }
        operator_delete__(subsectors);
        return;
      }
    }
  }
  return;
}

Assistant:

void P_LoadSubsectors (MapData * map)
{
	int i;
	DWORD maxseg = map->Size(ML_SEGS) / sizeof(segtype);

	numsubsectors = map->Size(ML_SSECTORS) / sizeof(subsectortype);

	if (numsubsectors == 0 || maxseg == 0 )
	{
		Printf ("This map has an incomplete BSP tree.\n");
		delete[] nodes;
		ForceNodeBuild = true;
		return;
	}

	subsectors = new subsector_t[numsubsectors];		
	map->Seek(ML_SSECTORS);
		
	memset (subsectors, 0, numsubsectors*sizeof(subsector_t));
	
	for (i = 0; i < numsubsectors; i++)
	{
		subsectortype subd;

		(*map->file) >> subd.numsegs >> subd.firstseg;

		if (subd.numsegs == 0)
		{
			Printf ("Subsector %i is empty.\n", i);
			delete[] subsectors;
			delete[] nodes;
			ForceNodeBuild = true;
			return;
		}

		subsectors[i].numlines = subd.numsegs;
		subsectors[i].firstline = (seg_t *)(size_t)subd.firstseg;

		if ((size_t)subsectors[i].firstline >= maxseg)
		{
			Printf ("Subsector %d contains invalid segs %u-%u\n"
				"The BSP will be rebuilt.\n", i, (unsigned)((size_t)subsectors[i].firstline),
				(unsigned)((size_t)subsectors[i].firstline) + subsectors[i].numlines - 1);
			ForceNodeBuild = true;
			delete[] nodes;
			delete[] subsectors;
			break;
		}
		else if ((size_t)subsectors[i].firstline + subsectors[i].numlines > maxseg)
		{
			Printf ("Subsector %d contains invalid segs %u-%u\n"
				"The BSP will be rebuilt.\n", i, maxseg,
				(unsigned)((size_t)subsectors[i].firstline) + subsectors[i].numlines - 1);
			ForceNodeBuild = true;
			delete[] nodes;
			delete[] subsectors;
			break;
		}
	}
}